

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_case_name,char *name,char *type_param,char *value_param,
          TypeId fixture_class_id,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestFactoryBase *factory)

{
  TestInfo *this;
  allocator local_7a;
  allocator local_79;
  SetUpTestCaseFunc local_78;
  string local_70;
  string local_50;
  
  local_78 = set_up_tc;
  this = (TestInfo *)operator_new(0xe0);
  std::__cxx11::string::string((string *)&local_50,test_case_name,&local_79);
  std::__cxx11::string::string((string *)&local_70,name,&local_7a);
  TestInfo::TestInfo(this,&local_50,&local_70,type_param,value_param,fixture_class_id,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  UnitTest::GetInstance();
  UnitTestImpl::AddTestInfo(UnitTest::GetInstance::instance.impl_,local_78,tear_down_tc,this);
  return this;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_case_name,
    const char* name,
    const char* type_param,
    const char* value_param,
    TypeId fixture_class_id,
    SetUpTestCaseFunc set_up_tc,
    TearDownTestCaseFunc tear_down_tc,
    TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_case_name, name, type_param, value_param,
                   fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}